

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void pick_sb_modes(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
                  RD_STATS *rd_cost,PARTITION_TYPE partition,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx
                  ,RD_STATS best_rd)

{
  uint8_t uVar1;
  AQ_MODE aq_mode;
  TX_SIZE_SEARCH_METHOD TVar2;
  int iVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  MB_MODE_INFO *mbmi;
  MB_RD_RECORD *pMVar6;
  int64_t iVar7;
  TX_MODE TVar8;
  uint uVar9;
  uint8_t **ppuVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  
  if (best_rd.rdcost < 0 && (cpi->sf).part_sf.use_best_rd_for_pruning != 0) {
    (ctx->rd_stats).rdcost = 0x7fffffffffffffff;
    (ctx->rd_stats).skip_txfm = '\0';
    rd_cost->rate = 0x7fffffff;
    rd_cost->zero_rate = 0;
    rd_cost->dist = 0x7fffffffffffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
    rd_cost->sse = 0x7fffffffffffffff;
    rd_cost->skip_txfm = '\0';
  }
  else {
    av1_set_offsets(cpi,&tile_data->tile_info,x,mi_row,mi_col,bsize);
    if (((cpi->sf).part_sf.reuse_prev_rd_results_for_part_ab == 0) || (ctx->rd_mode_is_ready == 0))
    {
      pSVar5 = (cpi->common).seq_params;
      uVar1 = pSVar5->monochrome;
      aq_mode = (cpi->oxcf).q_cfg.aq_mode;
      uVar15 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [pSVar5->sb_size] - 1;
      if (((uVar15 & mi_row) == 0) &&
         ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [pSVar5->sb_size] <=
          (int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [bsize] + (uVar15 & mi_col)))) {
        bVar11 = (byte)pSVar5->mib_size_log2;
        (*(cpi->mt_info).enc_row_mt.sync_read_ptr)
                  (&tile_data->row_mt_sync,
                   mi_row - (tile_data->tile_info).mi_row_start >> (bVar11 & 0x1f),
                   mi_col - (tile_data->tile_info).mi_col_start >> (bVar11 & 0x1f));
      }
      mbmi = *(x->e_mbd).mi;
      mbmi->bsize = bsize;
      mbmi->partition = partition;
      (x->e_mbd).tx_type_map = (x->txfm_search_info).tx_type_map_;
      (x->e_mbd).tx_type_map_stride =
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize]
      ;
      ppuVar10 = &x->plane[0].txb_entropy_ctx;
      uVar13 = 0;
      do {
        ppuVar10[-2] = (uint8_t *)ctx->coeff[uVar13];
        ppuVar10[-3] = (uint8_t *)ctx->qcoeff[uVar13];
        ppuVar10[-4] = (uint8_t *)ctx->dqcoeff[uVar13];
        ppuVar10[-1] = (uint8_t *)ctx->eobs[uVar13];
        *ppuVar10 = ctx->txb_entropy_ctx[uVar13];
        if (uVar1 != '\0') break;
        ppuVar10 = ppuVar10 + 0x11;
        bVar16 = uVar13 < 2;
        uVar13 = uVar13 + 1;
      } while (bVar16);
      ppuVar10 = &(x->e_mbd).plane[0].color_index_map;
      lVar14 = 0x21;
      do {
        *ppuVar10 = *(uint8_t **)((ctx->mic).mv + lVar14 * 2 + -2);
        lVar14 = lVar14 + 1;
        ppuVar10 = ppuVar10 + 0x146;
      } while (lVar14 == 0x22);
      ctx->skippable = 0;
      mbmi->skip_txfm = '\0';
      mbmi->field_0xa7 = mbmi->field_0xa7 & 0xbf;
      uVar15 = 0;
      uVar9 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&x->plane[0].src,bsize,0);
      x->source_variance = uVar9;
      bVar16 = (cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;
      (x->txfm_search_params).use_qm_dist_metric = (uint)bVar16;
      (x->txfm_search_params).use_default_intra_tx_type = 0;
      (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
      (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[0];
      (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[0];
      if (bVar16) {
        (x->txfm_search_params).use_transform_domain_distortion = 1;
      }
      else {
        (x->txfm_search_params).use_transform_domain_distortion =
             (cpi->winner_mode_params).use_transform_domain_distortion[0];
        uVar15 = (cpi->winner_mode_params).tx_domain_dist_threshold[0];
      }
      (x->txfm_search_params).tx_domain_dist_threshold = uVar15;
      (x->txfm_search_params).coeff_opt_thresholds[0] =
           (cpi->winner_mode_params).coeff_opt_thresholds[0][0];
      (x->txfm_search_params).coeff_opt_thresholds[1] =
           (cpi->winner_mode_params).coeff_opt_thresholds[0][1];
      TVar2 = (cpi->winner_mode_params).tx_size_search_methods[0];
      (x->txfm_search_params).tx_size_search_method = TVar2;
      TVar8 = '\0';
      if ((cpi->common).features.coded_lossless == false) {
        TVar8 = '\x02' - (TVar2 == '\x02');
      }
      (x->txfm_search_params).tx_mode_search_type = TVar8;
      (x->txfm_search_params).prune_2d_txfm_mode =
           (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
      if (((x->txfm_search_params).mode_eval_type != 0) &&
         (pMVar6 = (x->txfm_search_info).mb_rd_record, pMVar6 != (MB_RD_RECORD *)0x0)) {
        pMVar6->index_start = 0;
        pMVar6->num = 0;
      }
      (x->txfm_search_params).mode_eval_type = 0;
      iVar3 = x->rdmult;
      setup_block_rdmult(cpi,x,mi_row,mi_col,bsize,aq_mode,mbmi);
      iVar4 = x->rdmult;
      iVar12 = 1;
      if (1 < iVar4 >> 6) {
        iVar12 = iVar4 >> 6;
      }
      x->errorperbit = iVar12;
      if (((ulong)(uint)best_rd.rate == 0x7fffffff) ||
         (best_rd.rdcost == 0x7fffffffffffffff || best_rd.dist == 0x7fffffffffffffff)) {
        best_rd.rdcost = 0x7fffffffffffffff;
      }
      else if (best_rd.rate < 0) {
        best_rd.rdcost =
             best_rd.dist * 0x80 - ((long)((ulong)(uint)-best_rd.rate * (long)iVar4 + 0x100) >> 9);
      }
      else {
        best_rd.rdcost =
             best_rd.dist * 0x80 + ((long)((ulong)(uint)best_rd.rate * (long)iVar4 + 0x100) >> 9);
      }
      if ((cpi->sf).part_sf.use_best_rd_for_pruning == 0) {
        best_rd.rdcost = 0x7fffffffffffffff;
      }
      if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
        av1_rd_pick_intra_mode_sb(cpi,x,rd_cost,bsize,ctx,best_rd.rdcost);
      }
      else if (((cpi->common).seg.enabled == '\0') ||
              (((cpi->common).seg.feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x40) == 0)) {
        av1_rd_pick_inter_mode(cpi,tile_data,x,rd_cost,bsize,ctx,best_rd.rdcost);
      }
      else {
        av1_rd_pick_inter_mode_sb_seg_skip
                  (cpi,tile_data,x,mi_row,mi_col,rd_cost,bsize,ctx,best_rd.rdcost);
      }
      if (((BLOCK_16X8 < bsize) && (rd_cost->rate != 0x7fffffff)) && (aq_mode == '\x02')) {
        av1_caq_select_segment(cpi,x,bsize,mi_row,mi_col,rd_cost->rate);
      }
      x->rdmult = iVar3;
      if (rd_cost->rate == 0x7fffffff) {
        rd_cost->rdcost = 0x7fffffffffffffff;
      }
      (ctx->rd_stats).rate = rd_cost->rate;
      iVar7 = rd_cost->rdcost;
      (ctx->rd_stats).dist = rd_cost->dist;
      (ctx->rd_stats).rdcost = iVar7;
    }
    else {
      rd_cost->rate = (ctx->rd_stats).rate;
      iVar7 = (ctx->rd_stats).rdcost;
      rd_cost->dist = (ctx->rd_stats).dist;
      rd_cost->rdcost = iVar7;
    }
  }
  return;
}

Assistant:

static void pick_sb_modes(AV1_COMP *const cpi, TileDataEnc *tile_data,
                          MACROBLOCK *const x, int mi_row, int mi_col,
                          RD_STATS *rd_cost, PARTITION_TYPE partition,
                          BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx,
                          RD_STATS best_rd) {
  if (cpi->sf.part_sf.use_best_rd_for_pruning && best_rd.rdcost < 0) {
    ctx->rd_stats.rdcost = INT64_MAX;
    ctx->rd_stats.skip_txfm = 0;
    av1_invalid_rd_stats(rd_cost);
    return;
  }

  av1_set_offsets(cpi, &tile_data->tile_info, x, mi_row, mi_col, bsize);

  if (cpi->sf.part_sf.reuse_prev_rd_results_for_part_ab &&
      ctx->rd_mode_is_ready) {
    assert(ctx->mic.bsize == bsize);
    assert(ctx->mic.partition == partition);
    rd_cost->rate = ctx->rd_stats.rate;
    rd_cost->dist = ctx->rd_stats.dist;
    rd_cost->rdcost = ctx->rd_stats.rdcost;
    return;
  }

  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi;
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const AQ_MODE aq_mode = cpi->oxcf.q_cfg.aq_mode;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  int i;

  // This is only needed for real time/allintra row-mt enabled multi-threaded
  // encoding with cost update frequency set to COST_UPD_TILE/COST_UPD_OFF.
  wait_for_top_right_sb(&cpi->mt_info.enc_row_mt, &tile_data->row_mt_sync,
                        &tile_data->tile_info, cm->seq_params->sb_size,
                        cm->seq_params->mib_size_log2, bsize, mi_row, mi_col);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rd_pick_sb_modes_time);
#endif

  mbmi = xd->mi[0];
  mbmi->bsize = bsize;
  mbmi->partition = partition;

#if CONFIG_RD_DEBUG
  mbmi->mi_row = mi_row;
  mbmi->mi_col = mi_col;
#endif

  // Sets up the tx_type_map buffer in MACROBLOCKD.
  xd->tx_type_map = txfm_info->tx_type_map_;
  xd->tx_type_map_stride = mi_size_wide[bsize];

  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }

  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];

  ctx->skippable = 0;
  // Set to zero to make sure we do not use the previous encoded frame stats
  mbmi->skip_txfm = 0;
  // Reset skip mode flag.
  mbmi->skip_mode = 0;

  x->source_variance = av1_get_perpixel_variance_facade(
      cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, aq_mode, mbmi);
  // Set error per bit for current rdmult
  av1_set_error_per_bit(&x->errorperbit, x->rdmult);
  av1_rd_cost_update(x->rdmult, &best_rd);

  // If set best_rd.rdcost to INT64_MAX, the encoder will not use any previous
  // rdcost information for the following mode search.
  // Disabling the feature could get some coding gain, with encoder slowdown.
  if (!cpi->sf.part_sf.use_best_rd_for_pruning) {
    av1_invalid_rd_stats(&best_rd);
  }

  // Find best coding mode & reconstruct the MB so it is available
  // as a predictor for MBs that follow in the SB
  if (frame_is_intra_only(cm)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_rd_pick_intra_mode_sb_time);
#endif
    av1_rd_pick_intra_mode_sb(cpi, x, rd_cost, bsize, ctx, best_rd.rdcost);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_rd_pick_intra_mode_sb_time);
#endif
  } else {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_rd_pick_inter_mode_sb_time);
#endif
    if (segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
      av1_rd_pick_inter_mode_sb_seg_skip(cpi, tile_data, x, mi_row, mi_col,
                                         rd_cost, bsize, ctx, best_rd.rdcost);
    } else {
      av1_rd_pick_inter_mode(cpi, tile_data, x, rd_cost, bsize, ctx,
                             best_rd.rdcost);
    }
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_rd_pick_inter_mode_sb_time);
#endif
  }

  // Examine the resulting rate and for AQ mode 2 make a segment choice.
  if (rd_cost->rate != INT_MAX && aq_mode == COMPLEXITY_AQ &&
      bsize >= BLOCK_16X16) {
    av1_caq_select_segment(cpi, x, bsize, mi_row, mi_col, rd_cost->rate);
  }

  x->rdmult = orig_rdmult;

  // TODO(jingning) The rate-distortion optimization flow needs to be
  // refactored to provide proper exit/return handle.
  if (rd_cost->rate == INT_MAX) rd_cost->rdcost = INT64_MAX;

  ctx->rd_stats.rate = rd_cost->rate;
  ctx->rd_stats.dist = rd_cost->dist;
  ctx->rd_stats.rdcost = rd_cost->rdcost;

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rd_pick_sb_modes_time);
#endif
}